

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

Vector<double,_2,_true> __thiscall
Nova::Vector<double,_2,_true>::operator-(Vector<double,_2,_true> *this,Vector<double,_2,_true> *a)

{
  Vector<double,_2,_true> *in_RDX;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  Vector<double,_2,_true> VVar1;
  Vector<double,_2,_true> *a_local;
  Vector<double,_2,_true> *this_local;
  Vector<double,_2,_true> *data_copy;
  
  Vector(this,a);
  operator-=(this,in_RDX);
  VVar1._data._M_elems[1] = in_XMM1_Qa;
  VVar1._data._M_elems[0] = extraout_XMM0_Qa;
  return (Vector<double,_2,_true>)VVar1._data._M_elems;
}

Assistant:

Vector operator-(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy-=a;
        return data_copy;
    }